

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Generic.cpp
# Opt level: O1

bool __thiscall SRUP_MSG_GENERIC::Serialize(SRUP_MSG_GENERIC *this,bool preSign)

{
  uint8_t uVar1;
  uint8_t *MSB;
  uint8_t *LSB;
  uint8_t *puVar2;
  bool bVar3;
  long lVar4;
  ulong __n;
  
  MSB = (uint8_t *)operator_new__(1);
  LSB = (uint8_t *)operator_new__(1);
  (this->super_SRUP_MSG).m_serial_length = (this->super_SRUP_MSG).m_token_len + 0x14;
  puVar2 = (this->super_SRUP_MSG).m_serialized;
  if (puVar2 != (uint8_t *)0x0) {
    operator_delete__(puVar2);
  }
  if ((((this->super_SRUP_MSG).m_sequence_ID == (uint64_t *)0x0) ||
      ((this->super_SRUP_MSG).m_sender_ID == (uint64_t *)0x0)) ||
     ((this->super_SRUP_MSG).m_token == (uint8_t *)0x0)) {
    bVar3 = false;
  }
  else {
    __n = (ulong)(this->super_SRUP_MSG).m_serial_length;
    puVar2 = (uint8_t *)operator_new__(__n);
    (this->super_SRUP_MSG).m_serialized = puVar2;
    lVar4 = 0;
    memset(puVar2,0,__n);
    *puVar2 = *(this->super_SRUP_MSG).m_version;
    puVar2[1] = *(this->super_SRUP_MSG).m_msgtype;
    do {
      uVar1 = SRUP_MSG::getByteVal(*(this->super_SRUP_MSG).m_sequence_ID,(uint8_t)lVar4);
      (this->super_SRUP_MSG).m_serialized[lVar4 + 2] = uVar1;
      lVar4 = lVar4 + 1;
    } while ((int)lVar4 != 8);
    lVar4 = 0;
    do {
      uVar1 = SRUP_MSG::getByteVal(*(this->super_SRUP_MSG).m_sender_ID,(uint8_t)lVar4);
      (this->super_SRUP_MSG).m_serialized[lVar4 + 10] = uVar1;
      lVar4 = lVar4 + 1;
    } while ((int)lVar4 != 8);
    SRUP_MSG::encodeLength(LSB,MSB,(this->super_SRUP_MSG).m_token_len);
    (this->super_SRUP_MSG).m_serialized[0x12] = *MSB;
    (this->super_SRUP_MSG).m_serialized[0x13] = *LSB;
    memcpy((this->super_SRUP_MSG).m_serialized + 0x14,(this->super_SRUP_MSG).m_token,
           (ulong)(this->super_SRUP_MSG).m_token_len);
    bVar3 = true;
  }
  operator_delete__(MSB);
  operator_delete__(LSB);
  return bVar3;
}

Assistant:

bool SRUP_MSG_GENERIC::Serialize(bool preSign)
{
    uint8_t *msb;
    uint8_t *lsb;

    msb = new uint8_t[1];
    lsb = new uint8_t[1];

    const unsigned short header_size = 18; // 2 + 8 + 8 - to include session ID & sender ID...
    unsigned short p = 0;

    // Serial length is the header + two-byte token length, plus the length of the token in bytes.
    m_serial_length = header_size + 2 + m_token_len;

    delete[] m_serialized;

    // Now check that we have a sequence ID...
    // Technically we don't need one - but we might want use this to check a generic message for a valid sequence ID
    // before we map it onto the correct message type - so we'll include it here.
    if (m_sequence_ID == nullptr)
    {
        delete[] msb;
        delete[] lsb;
        return false;
    }

    // ...by the same logic - we'll also check for the sender ID - as it too, is a part of the "base" message...
    if (m_sender_ID == nullptr)
    {
        delete[] msb;
        delete[] lsb;
        return false;
    }

    // ...and lastly for the token.
    if (m_token == nullptr)
    {
        delete[] msb;
        delete[] lsb;
        return false;
    }

    m_serialized = new unsigned char[m_serial_length];
    std::memset(m_serialized, 0, m_serial_length);

    // The first two fields are fixed length (1 byte each).
    std::memcpy(m_serialized, m_version, 1);
    p+=1;
    std::memcpy(m_serialized + p, m_msgtype, 1);
    p+=1;

    // Now we need to add the Sequence ID
    for (int x=0;x<8;x++)
    {
        uint8_t byte;
        byte = getByteVal(*m_sequence_ID, x);
        std::memcpy(m_serialized + p, &byte, 1);
        p+=1;
    }

    // And the sender ID
    for (int x=0;x<8;x++)
    {
        uint8_t byte;
        byte = getByteVal(*m_sender_ID, x);
        std::memcpy(m_serialized + p, &byte, 1);
        p+=1;
    }

    // And lastly the token...
    encodeLength(lsb, msb, m_token_len);
    std::memcpy(m_serialized + p, msb, 1);
    p+=1;
    std::memcpy(m_serialized + p, lsb, 1);
    p+=1;
    std::memcpy(m_serialized + p, m_token, m_token_len);

    delete[] msb;
    delete[] lsb;

    return true;
}